

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_equal.c
# Opt level: O3

_Bool run_container_equals_array(run_container_t *container1,array_container_t *container2)

{
  ushort uVar1;
  _Bool _Var2;
  int iVar3;
  long lVar4;
  uint uVar5;
  
  iVar3 = run_container_cardinality(container1);
  if (iVar3 == container2->cardinality) {
    _Var2 = true;
    if (0 < (long)container1->n_runs) {
      lVar4 = 0;
      iVar3 = 0;
      do {
        uVar1 = container1->runs[lVar4].value;
        if ((container2->array[iVar3] != uVar1) ||
           (uVar5 = (uint)container1->runs[lVar4].length,
           uVar1 + uVar5 != (uint)container2->array[iVar3 + uVar5])) goto LAB_0011a7d7;
        iVar3 = iVar3 + uVar5 + 1;
        lVar4 = lVar4 + 1;
      } while (container1->n_runs != lVar4);
    }
  }
  else {
LAB_0011a7d7:
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool run_container_equals_array(const run_container_t* container1,
                                const array_container_t* container2) {
    if (run_container_cardinality(container1) != container2->cardinality)
        return false;
    int32_t pos = 0;
    for (int i = 0; i < container1->n_runs; ++i) {
        const uint32_t run_start = container1->runs[i].value;
        const uint32_t le = container1->runs[i].length;

        if (container2->array[pos] != run_start) {
            return false;
        }

        if (container2->array[pos + le] != run_start + le) {
            return false;
        }

        pos += le + 1;
    }
    return true;
}